

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_half(secp256k1_fe *r)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  secp256k1_fe *a;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  secp256k1_modinv64_modinfo *modinfo;
  secp256k1_fe *psVar12;
  secp256k1_fe *psVar13;
  secp256k1_fe *psVar14;
  secp256k1_fe *a_00;
  long lVar15;
  ulong uVar16;
  uint64_t *puVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  uint64_t uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  secp256k1_fe *psStack_198;
  secp256k1_fe *psStack_190;
  uint64_t uStack_178;
  uint64_t uStack_170;
  ulong uStack_168;
  ulong uStack_160;
  ulong uStack_158;
  secp256k1_fe sStack_150;
  secp256k1_fe *psStack_120;
  ulong uStack_118;
  ulong uStack_110;
  ulong uStack_108;
  uint64_t uStack_100;
  secp256k1_fe *psStack_f8;
  ulong uStack_f0;
  secp256k1_fe *psStack_e8;
  secp256k1_fe sStack_e0;
  secp256k1_modinv64_trans2x2 sStack_b0;
  secp256k1_fe sStack_90;
  secp256k1_modinv64_signed62 sStack_60;
  secp256k1_fe *psStack_38;
  
  secp256k1_fe_verify(r);
  psVar14 = r;
  secp256k1_fe_verify_magnitude(r,0x1f);
  modinfo = (secp256k1_modinv64_modinfo *)r->n[0];
  uVar2 = -(ulong)((uint)modinfo & 1);
  uVar6 = uVar2 >> 0xc;
  uVar5 = (long)(modinfo->modulus).v + (uVar6 & 0xffffefffffc2f);
  if ((uVar5 & 1) == 0) {
    uVar3 = (uVar2 >> 0x10) + r->n[4];
    uVar7 = uVar6 + r->n[3];
    uVar19 = (uint)(uVar2 >> 0x2c);
    auVar25._0_8_ = CONCAT44(uVar19,(int)uVar6);
    auVar25._8_4_ = (int)uVar6;
    auVar25._12_4_ = uVar19;
    uVar2 = auVar25._0_8_ + r->n[1];
    uVar6 = auVar25._8_8_ + r->n[2];
    r->n[0] = ((ulong)((uint)uVar2 & 1) << 0x33) + (uVar5 >> 1);
    r->n[1] = ((uVar6 & 1) << 0x33) + (uVar2 >> 1);
    r->n[2] = ((uVar7 & 1) << 0x33) + (uVar6 >> 1);
    r->n[3] = ((ulong)((uint)uVar3 & 1) << 0x33) + (uVar7 >> 1);
    r->n[4] = uVar3 >> 1;
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_half_cold_1();
  uVar5 = 0;
  sStack_90.n[2] = 0;
  sStack_90.n[3] = 0;
  sStack_90.n[0] = 0;
  sStack_90.n[1] = 0;
  sStack_90.n[4] = 0;
  sStack_60.v[1] = 0;
  sStack_60.v[4] = 0;
  sStack_60.v[2] = 0;
  sStack_60.v[3] = 0;
  sStack_60.v[0] = 1;
  sStack_150.n[4] = (modinfo->modulus).v[4];
  sStack_150.n[0] = (modinfo->modulus).v[0];
  uStack_160 = (modinfo->modulus).v[1];
  uStack_168 = (modinfo->modulus).v[2];
  sStack_150.n[3] = (modinfo->modulus).v[3];
  sStack_e0.n[0] = psVar14->n[0];
  uStack_170 = psVar14->n[1];
  uStack_178 = psVar14->n[2];
  uStack_158 = psVar14->n[3];
  uVar23 = psVar14->n[4];
  uVar3 = 0xffffffffffffffff;
  uVar2 = sStack_150.n[0];
  uVar6 = sStack_e0.n[0];
  psVar13 = (secp256k1_fe *)sStack_150.n[4];
  psStack_190 = (secp256k1_fe *)sStack_150.n[3];
  sStack_150.n[1] = uStack_160;
  sStack_150.n[2] = uStack_168;
  psStack_120 = psVar14;
  sStack_e0.n[1] = uStack_170;
  sStack_e0.n[2] = uStack_178;
  sStack_e0.n[3] = uStack_158;
  sStack_e0.n[4] = uVar23;
  psStack_38 = r;
  do {
    uVar22 = 8;
    lVar8 = 3;
    uVar7 = 0;
    uVar20 = 0;
    psVar12 = (secp256k1_fe *)0x8;
    psStack_198 = (secp256k1_fe *)0x8;
    uVar4 = uVar6;
    uVar9 = uVar2;
    do {
      uStack_108 = uVar5;
      uStack_100 = uVar23;
      psStack_f8 = psVar13;
      if ((uVar9 & 1) == 0) {
        secp256k1_modinv64_cold_29();
LAB_00146478:
        secp256k1_modinv64_cold_1();
LAB_0014647d:
        secp256k1_modinv64_cold_2();
LAB_00146482:
        secp256k1_modinv64_cold_28();
        goto LAB_00146487;
      }
      psVar14 = (secp256k1_fe *)(uVar7 * uVar6 + uVar22 * uVar2);
      psVar12 = (secp256k1_fe *)(uVar9 << ((byte)lVar8 & 0x3f));
      if (psVar14 != psVar12) goto LAB_00146478;
      psVar14 = (secp256k1_fe *)((long)psStack_198 * uVar6 + uVar20 * uVar2);
      psVar12 = (secp256k1_fe *)(uVar4 << ((byte)lVar8 & 0x3f));
      if (psVar14 != psVar12) goto LAB_0014647d;
      psVar12 = (secp256k1_fe *)((long)uVar3 >> 0x3f);
      uStack_f0 = (ulong)((uint)uVar4 & 1);
      uVar16 = -uStack_f0;
      psVar14 = (secp256k1_fe *)((ulong)psVar12 & uVar16);
      psStack_e8 = psVar12;
      if ((uVar3 ^ (ulong)psVar14) - 0x251 < 0xfffffffffffffb61) goto LAB_00146482;
      uVar3 = (uVar3 ^ (ulong)psVar14) - 1;
      psStack_198 = (secp256k1_fe *)
                    ((long)psStack_198->n + (((ulong)psVar12 ^ uVar7) - (long)psVar12 & uVar16));
      uVar7 = (uVar7 + ((ulong)psStack_198 & (ulong)psVar14)) * 2;
      uVar20 = uVar20 + (((ulong)psVar12 ^ uVar22) - (long)psVar12 & uVar16);
      uVar22 = (uVar22 + (uVar20 & (ulong)psVar14)) * 2;
      uVar16 = (((ulong)psVar12 ^ uVar9) - (long)psVar12 & uVar16) + uVar4;
      uVar4 = uVar16 >> 1;
      uVar9 = uVar9 + (uVar16 & (ulong)psVar14);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x3e);
    psVar12 = (secp256k1_fe *)(uVar7 * uVar20);
    psVar14 = psStack_198;
    sStack_b0.u = uVar22;
    sStack_b0.v = uVar7;
    sStack_b0.q = uVar20;
    sStack_b0.r = (int64_t)psStack_198;
    if ((SUB168(SEXT816((long)uVar22) * SEXT816((long)psStack_198),8) -
        SUB168(SEXT816((long)uVar7) * SEXT816((long)uVar20),8)) -
        (ulong)((secp256k1_fe *)(uVar22 * (long)psStack_198) < psVar12) != 2 ||
        (long)(uVar22 * (long)psStack_198) - (long)psVar12 != 0) {
LAB_00146487:
      secp256k1_modinv64_cold_3();
LAB_0014648c:
      secp256k1_modinv64_cold_27();
LAB_00146491:
      secp256k1_modinv64_cold_26();
LAB_00146496:
      a = psVar14;
      secp256k1_modinv64_cold_25();
LAB_0014649b:
      secp256k1_modinv64_cold_24();
LAB_001464a0:
      secp256k1_modinv64_cold_4();
LAB_001464a5:
      secp256k1_modinv64_cold_5();
LAB_001464aa:
      secp256k1_modinv64_cold_6();
LAB_001464af:
      secp256k1_modinv64_cold_7();
LAB_001464b4:
      secp256k1_modinv64_cold_8();
LAB_001464b9:
      secp256k1_modinv64_cold_9();
LAB_001464be:
      secp256k1_modinv64_cold_10();
LAB_001464c3:
      secp256k1_modinv64_cold_11();
LAB_001464c8:
      secp256k1_modinv64_cold_12();
LAB_001464cd:
      secp256k1_modinv64_cold_13();
LAB_001464d2:
      secp256k1_modinv64_cold_14();
LAB_001464d7:
      secp256k1_modinv64_cold_15();
LAB_001464dc:
      secp256k1_modinv64_cold_23();
      psVar13 = psVar12;
LAB_001464e1:
      secp256k1_modinv64_cold_22();
      psVar14 = a;
LAB_001464e6:
      a_00 = psVar14;
      secp256k1_modinv64_cold_21();
LAB_001464eb:
      secp256k1_modinv64_cold_20();
LAB_001464f0:
      psVar14 = a_00;
      secp256k1_modinv64_cold_19();
LAB_001464f5:
      secp256k1_modinv64_cold_18();
      goto LAB_001464fa;
    }
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)&sStack_90,&sStack_60,&sStack_b0,modinfo);
    psVar14 = &sStack_150;
    psVar12 = (secp256k1_fe *)0x5;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,-1);
    if (iVar1 < 1) goto LAB_0014648c;
    psVar14 = &sStack_150;
    psVar12 = (secp256k1_fe *)0x5;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,1);
    if (0 < iVar1) goto LAB_00146491;
    a = &sStack_e0;
    psVar12 = (secp256k1_fe *)0x5;
    psVar14 = a;
    iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a,5,&modinfo->modulus,-1);
    if (iVar1 < 1) goto LAB_00146496;
    psVar12 = (secp256k1_fe *)0x5;
    iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a,5,&modinfo->modulus,1);
    if (-1 < iVar1) goto LAB_0014649b;
    a = (secp256k1_fe *)(uVar22 * uVar2);
    psVar12 = SUB168(SEXT816((long)uVar22) * SEXT816((long)uVar2),8);
    uVar5 = uVar7 * uVar6;
    lVar8 = SUB168(SEXT816((long)uVar7) * SEXT816((long)uVar6),8);
    if ((-1 < lVar8) &&
       (uVar4 = (ulong)((secp256k1_fe *)(-1 - uVar5) < a),
       lVar10 = (0x7fffffffffffffff - lVar8) - (long)psVar12,
       (SBORROW8(0x7fffffffffffffff - lVar8,(long)psVar12) != SBORROW8(lVar10,uVar4)) !=
       (long)(lVar10 - uVar4) < 0)) goto LAB_001464a0;
    puVar17 = (uint64_t *)((long)a->n + uVar5);
    lVar8 = (long)psVar12->n + (ulong)CARRY8(uVar5,(ulong)a) + lVar8;
    a = (secp256k1_fe *)(uVar20 * uVar2);
    psVar12 = SUB168(SEXT816((long)uVar20) * SEXT816((long)uVar2),8);
    uVar2 = (long)psStack_198 * uVar6;
    lVar10 = SUB168(SEXT816((long)psStack_198) * SEXT816((long)uVar6),8);
    if ((-1 < lVar10) &&
       (uVar6 = (ulong)((secp256k1_fe *)(-1 - uVar2) < a),
       lVar11 = (0x7fffffffffffffff - lVar10) - (long)psVar12,
       (SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar12) != SBORROW8(lVar11,uVar6)) !=
       (long)(lVar11 - uVar6) < 0)) goto LAB_001464a5;
    bVar24 = CARRY8((ulong)a,uVar2);
    a = (secp256k1_fe *)((long)a->n + uVar2);
    psVar12 = (secp256k1_fe *)((long)psVar12->n + (ulong)bVar24 + lVar10);
    if (((ulong)puVar17 & 0x3ffffffffffffffe) != 0) goto LAB_001464aa;
    if (((ulong)a & 0x3fffffffffffffff) != 0) goto LAB_001464af;
    uVar2 = (ulong)puVar17 >> 0x3e | lVar8 * 4;
    uVar5 = uStack_160 * uVar22 + uVar2;
    lVar15 = SUB168(SEXT816((long)uStack_160) * SEXT816((long)uVar22),8) + (lVar8 >> 0x3e) +
             (ulong)CARRY8(uStack_160 * uVar22,uVar2);
    uVar6 = uStack_170 * uVar7;
    lVar11 = SUB168(SEXT816((long)uStack_170) * SEXT816((long)uVar7),8);
    uVar2 = (ulong)(-uVar6 - 1 < uVar5);
    lVar8 = (0x7fffffffffffffff - lVar11) - lVar15;
    lVar18 = (-0x8000000000000000 - lVar11) - (ulong)(uVar6 != 0);
    lVar10 = lVar15 - lVar18;
    bVar24 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar15) != SBORROW8(lVar8,uVar2)) ==
             (long)(lVar8 - uVar2) < 0;
    if (lVar11 < 0) {
      bVar24 = (SBORROW8(lVar15,lVar18) != SBORROW8(lVar10,(ulong)(uVar5 < -uVar6))) ==
               (long)(lVar10 - (ulong)(uVar5 < -uVar6)) < 0;
    }
    if (!bVar24) goto LAB_001464b4;
    uVar2 = (ulong)a >> 0x3e | (long)psVar12 * 4;
    uVar9 = uStack_160 * uVar20 + uVar2;
    lVar10 = SUB168(SEXT816((long)uStack_160) * SEXT816((long)uVar20),8) + ((long)psVar12 >> 0x3e) +
             (ulong)CARRY8(uStack_160 * uVar20,uVar2);
    uVar4 = uStack_170 * (long)psStack_198;
    a = SUB168(SEXT816((long)uStack_170) * SEXT816((long)psStack_198),8);
    uVar2 = (ulong)(-uVar4 - 1 < uVar9);
    lVar8 = (0x7fffffffffffffff - (long)a) - lVar10;
    psVar12 = (secp256k1_fe *)((-0x8000000000000000 - (long)a) - (ulong)(uVar4 != 0));
    bVar24 = (SBORROW8(0x7fffffffffffffff - (long)a,lVar10) != SBORROW8(lVar8,uVar2)) ==
             (long)(lVar8 - uVar2) < 0;
    if ((long)a < 0) {
      bVar24 = (SBORROW8(lVar10,(long)psVar12) !=
               SBORROW8(lVar10 - (long)psVar12,(ulong)(uVar9 < -uVar4))) ==
               (long)((lVar10 - (long)psVar12) - (ulong)(uVar9 < -uVar4)) < 0;
    }
    if (!bVar24) goto LAB_001464b9;
    lVar8 = lVar11 + lVar15 + (ulong)CARRY8(uVar6,uVar5);
    a = (secp256k1_fe *)((long)a->n + (ulong)CARRY8(uVar4,uVar9) + lVar10);
    uVar2 = lVar8 * 4 | uVar6 + uVar5 >> 0x3e;
    sStack_150.n[0] = uVar6 + uVar5 & 0x3fffffffffffffff;
    uStack_110 = uVar4 + uVar9 & 0x3fffffffffffffff;
    uVar5 = uStack_168 * uVar22 + uVar2;
    lVar10 = (lVar8 >> 0x3e) + SUB168(SEXT816((long)uStack_168) * SEXT816((long)uVar22),8) +
             (ulong)CARRY8(uStack_168 * uVar22,uVar2);
    uVar6 = uStack_178 * uVar7;
    lVar11 = SUB168(SEXT816((long)uStack_178) * SEXT816((long)uVar7),8);
    uVar2 = (ulong)(-uVar6 - 1 < uVar5);
    lVar8 = (0x7fffffffffffffff - lVar11) - lVar10;
    psVar12 = (secp256k1_fe *)((-0x8000000000000000 - lVar11) - (ulong)(uVar6 != 0));
    bVar24 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar10) != SBORROW8(lVar8,uVar2)) ==
             (long)(lVar8 - uVar2) < 0;
    if (lVar11 < 0) {
      bVar24 = (SBORROW8(lVar10,(long)psVar12) !=
               SBORROW8(lVar10 - (long)psVar12,(ulong)(uVar5 < -uVar6))) ==
               (long)((lVar10 - (long)psVar12) - (ulong)(uVar5 < -uVar6)) < 0;
    }
    sStack_e0.n[0] = uStack_110;
    if (!bVar24) goto LAB_001464be;
    uVar2 = uVar4 + uVar9 >> 0x3e | (long)a * 4;
    uVar9 = uStack_168 * uVar20 + uVar2;
    psVar12 = (secp256k1_fe *)
              (SUB168(SEXT816((long)uStack_168) * SEXT816((long)uVar20),8) + ((long)a >> 0x3e) +
              (ulong)CARRY8(uStack_168 * uVar20,uVar2));
    uVar4 = uStack_178 * (long)psStack_198;
    lVar18 = SUB168(SEXT816((long)uStack_178) * SEXT816((long)psStack_198),8);
    uVar2 = (ulong)(-uVar4 - 1 < uVar9);
    lVar8 = (0x7fffffffffffffff - lVar18) - (long)psVar12;
    lVar21 = (-0x8000000000000000 - lVar18) - (ulong)(uVar4 != 0);
    lVar15 = (long)psVar12 - lVar21;
    bVar24 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)psVar12) != SBORROW8(lVar8,uVar2)) ==
             (long)(lVar8 - uVar2) < 0;
    if (lVar18 < 0) {
      bVar24 = (SBORROW8((long)psVar12,lVar21) != SBORROW8(lVar15,(ulong)(uVar9 < -uVar4))) ==
               (long)(lVar15 - (ulong)(uVar9 < -uVar4)) < 0;
    }
    a = (secp256k1_fe *)(ulong)bVar24;
    uStack_118 = sStack_150.n[0];
    if (bVar24 == false) goto LAB_001464c3;
    lVar8 = lVar10 + lVar11 + (ulong)CARRY8(uVar5,uVar6);
    psVar12 = (secp256k1_fe *)((long)psVar12->n + (ulong)CARRY8(uVar9,uVar4) + lVar18);
    uVar2 = lVar8 * 4 | uVar5 + uVar6 >> 0x3e;
    uStack_160 = uVar5 + uVar6 & 0x3fffffffffffffff;
    uStack_170 = uVar9 + uVar4 & 0x3fffffffffffffff;
    uVar5 = (long)psStack_190 * uVar22 + uVar2;
    lVar10 = (lVar8 >> 0x3e) + SUB168(SEXT816((long)psStack_190) * SEXT816((long)uVar22),8) +
             (ulong)CARRY8((long)psStack_190 * uVar22,uVar2);
    uVar6 = uStack_158 * uVar7;
    lVar11 = SUB168(SEXT816((long)uStack_158) * SEXT816((long)uVar7),8);
    uVar2 = (ulong)(-uVar6 - 1 < uVar5);
    lVar8 = (0x7fffffffffffffff - lVar11) - lVar10;
    a = (secp256k1_fe *)((-0x8000000000000000 - lVar11) - (ulong)(uVar6 != 0));
    bVar24 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar10) != SBORROW8(lVar8,uVar2)) ==
             (long)(lVar8 - uVar2) < 0;
    if (lVar11 < 0) {
      bVar24 = (SBORROW8(lVar10,(long)a) != SBORROW8(lVar10 - (long)a,(ulong)(uVar5 < -uVar6))) ==
               (long)((lVar10 - (long)a) - (ulong)(uVar5 < -uVar6)) < 0;
    }
    sStack_150.n[1] = uStack_160;
    sStack_e0.n[1] = uStack_170;
    if (!bVar24) goto LAB_001464c8;
    uVar2 = uVar9 + uVar4 >> 0x3e | (long)psVar12 * 4;
    uVar9 = (long)psStack_190 * uVar20 + uVar2;
    a = (secp256k1_fe *)
        (SUB168(SEXT816((long)psStack_190) * SEXT816((long)uVar20),8) + ((long)psVar12 >> 0x3e) +
        (ulong)CARRY8((long)psStack_190 * uVar20,uVar2));
    uVar4 = uStack_158 * (long)psStack_198;
    lVar18 = SUB168(SEXT816((long)uStack_158) * SEXT816((long)psStack_198),8);
    uVar2 = (ulong)(-uVar4 - 1 < uVar9);
    lVar8 = (0x7fffffffffffffff - lVar18) - (long)a;
    lVar21 = (-0x8000000000000000 - lVar18) - (ulong)(uVar4 != 0);
    lVar15 = (long)a - lVar21;
    bVar24 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)a) != SBORROW8(lVar8,uVar2)) ==
             (long)(lVar8 - uVar2) < 0;
    if (lVar18 < 0) {
      bVar24 = (SBORROW8((long)a,lVar21) != SBORROW8(lVar15,(ulong)(uVar9 < -uVar4))) ==
               (long)(lVar15 - (ulong)(uVar9 < -uVar4)) < 0;
    }
    psVar12 = (secp256k1_fe *)(ulong)bVar24;
    if (bVar24 == false) goto LAB_001464cd;
    lVar8 = lVar10 + lVar11 + (ulong)CARRY8(uVar5,uVar6);
    a = (secp256k1_fe *)((long)a->n + (ulong)CARRY8(uVar9,uVar4) + lVar18);
    uVar2 = lVar8 * 4 | uVar5 + uVar6 >> 0x3e;
    uStack_168 = uVar5 + uVar6 & 0x3fffffffffffffff;
    uStack_178 = uVar9 + uVar4 & 0x3fffffffffffffff;
    uVar5 = (long)psStack_f8 * uVar22 + uVar2;
    lVar11 = (lVar8 >> 0x3e) + SUB168(SEXT816((long)psStack_f8) * SEXT816((long)uVar22),8) +
             (ulong)CARRY8((long)psStack_f8 * uVar22,uVar2);
    uVar6 = uStack_100 * uVar7;
    psVar12 = SUB168(SEXT816((long)uStack_100) * SEXT816((long)uVar7),8);
    uVar2 = (ulong)(-uVar6 - 1 < uVar5);
    lVar8 = (0x7fffffffffffffff - (long)psVar12) - lVar11;
    lVar15 = (-0x8000000000000000 - (long)psVar12) - (ulong)(uVar6 != 0);
    lVar10 = lVar11 - lVar15;
    bVar24 = (SBORROW8(0x7fffffffffffffff - (long)psVar12,lVar11) != SBORROW8(lVar8,uVar2)) ==
             (long)(lVar8 - uVar2) < 0;
    if ((long)psVar12 < 0) {
      bVar24 = (SBORROW8(lVar11,lVar15) != SBORROW8(lVar10,(ulong)(uVar5 < -uVar6))) ==
               (long)(lVar10 - (ulong)(uVar5 < -uVar6)) < 0;
    }
    sStack_150.n[2] = uStack_168;
    sStack_e0.n[2] = uStack_178;
    if (!bVar24) goto LAB_001464d2;
    uVar2 = uVar9 + uVar4 >> 0x3e | (long)a * 4;
    uVar22 = (long)psStack_f8 * uVar20 + uVar2;
    lVar18 = SUB168(SEXT816((long)psStack_f8) * SEXT816((long)uVar20),8) + ((long)a >> 0x3e) +
             (ulong)CARRY8((long)psStack_f8 * uVar20,uVar2);
    uVar7 = uStack_100 * (long)psStack_198;
    lVar15 = SUB168(SEXT816((long)uStack_100) * SEXT816((long)psStack_198),8);
    uVar2 = (ulong)(-uVar7 - 1 < uVar22);
    lVar8 = (0x7fffffffffffffff - lVar15) - lVar18;
    lVar21 = (-0x8000000000000000 - lVar15) - (ulong)(uVar7 != 0);
    lVar10 = lVar18 - lVar21;
    bVar24 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar18) != SBORROW8(lVar8,uVar2)) ==
             (long)(lVar8 - uVar2) < 0;
    if (lVar15 < 0) {
      bVar24 = (SBORROW8(lVar18,lVar21) != SBORROW8(lVar10,(ulong)(uVar22 < -uVar7))) ==
               (long)(lVar10 - (ulong)(uVar22 < -uVar7)) < 0;
    }
    a = (secp256k1_fe *)(ulong)bVar24;
    if (bVar24 == false) goto LAB_001464d7;
    lVar8 = (long)psVar12->n + (ulong)CARRY8(uVar5,uVar6) + lVar11;
    lVar10 = lVar18 + lVar15 + (ulong)CARRY8(uVar22,uVar7);
    psVar12 = (secp256k1_fe *)(lVar8 * 4 | uVar5 + uVar6 >> 0x3e);
    a = (secp256k1_fe *)(uVar5 + uVar6 & 0x3fffffffffffffff);
    uStack_158 = uVar22 + uVar7 & 0x3fffffffffffffff;
    sStack_150.n[3] = (uint64_t)a;
    sStack_e0.n[3] = uStack_158;
    if ((lVar8 >> 0x3e) + -1 + (ulong)((secp256k1_fe *)0x7fffffffffffffff < psVar12) != -1)
    goto LAB_001464dc;
    uVar23 = uVar22 + uVar7 >> 0x3e | lVar10 * 4;
    psVar13 = psVar12;
    sStack_150.n[4] = (uint64_t)psVar12;
    if ((lVar10 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar23) != -1) goto LAB_001464e1;
    a_00 = &sStack_150;
    psVar13 = (secp256k1_fe *)0x5;
    psVar14 = a_00;
    sStack_e0.n[4] = uVar23;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&modinfo->modulus,-1);
    if (iVar1 < 1) goto LAB_001464e6;
    psVar13 = (secp256k1_fe *)0x5;
    iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,&modinfo->modulus,1)
    ;
    if (0 < iVar1) goto LAB_001464eb;
    psVar14 = &sStack_e0;
    psVar13 = (secp256k1_fe *)0x5;
    a_00 = psVar14;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,-1);
    if (iVar1 < 1) goto LAB_001464f0;
    psVar13 = (secp256k1_fe *)0x5;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,1);
    if (-1 < iVar1) goto LAB_001464f5;
    uVar19 = (int)uStack_108 + 1;
    uVar5 = (ulong)uVar19;
    uVar2 = uStack_118;
    uVar6 = uStack_110;
    psVar13 = psVar12;
    psStack_190 = a;
  } while (uVar19 != 10);
  psVar14 = &sStack_e0;
  psVar13 = (secp256k1_fe *)0x5;
  iVar1 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar14,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar1 == 0) {
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)&sStack_150,5,&SECP256K1_SIGNED62_ONE,-1);
    psVar12 = psStack_120;
    if (iVar1 != 0) {
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_150,5,&SECP256K1_SIGNED62_ONE,1);
      if (iVar1 != 0) {
        psVar13 = (secp256k1_fe *)0x5;
        psVar14 = psVar12;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar12,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar1 == 0) {
          psVar14 = &sStack_90;
          psVar13 = (secp256k1_fe *)0x5;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar14,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar1 == 0) {
            psVar14 = &sStack_150;
            psVar13 = (secp256k1_fe *)0x5;
            iVar1 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,1);
            if (iVar1 == 0) goto LAB_00146431;
          }
        }
        goto LAB_001464ff;
      }
    }
LAB_00146431:
    secp256k1_modinv64_normalize_62
              ((secp256k1_modinv64_signed62 *)&sStack_90,sStack_150.n[4],modinfo);
    psVar12->n[4] = sStack_90.n[4];
    psVar12->n[2] = sStack_90.n[2];
    psVar12->n[3] = sStack_90.n[3];
    psVar12->n[0] = sStack_90.n[0];
    psVar12->n[1] = sStack_90.n[1];
    return;
  }
LAB_001464fa:
  secp256k1_modinv64_cold_16();
LAB_001464ff:
  secp256k1_modinv64_cold_17();
  uVar3 = (ulong)((uint)psVar13->n[0] & 1);
  uVar7 = -uVar3;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar13);
  uVar2 = psVar13->n[1] << 0x3f | psVar13->n[0] >> 1;
  psVar14->n[0] = uVar2 + (uVar7 & 0xdfe92f46681b20a1);
  uVar5 = psVar13->n[2] << 0x3f | psVar13->n[1] >> 1;
  uVar2 = (ulong)CARRY8(uVar7 & 0xdfe92f46681b20a1,uVar2);
  uVar6 = (uVar7 & 0x5d576e7357a4501d) + uVar5;
  bVar24 = CARRY8(uVar7 & 0x5d576e7357a4501d,uVar5) || CARRY8(uVar6,uVar2);
  psVar14->n[1] = uVar6 + uVar2;
  uVar2 = psVar13->n[3] << 0x3f | psVar13->n[2] >> 1;
  psVar14->n[2] = (uVar2 - uVar3) + (ulong)bVar24;
  psVar14->n[3] =
       (uVar7 & 0x7fffffffffffffff) + (psVar13->n[3] >> 1) +
       (ulong)(CARRY8(uVar2,uVar7) || CARRY8(uVar2 + uVar7,(ulong)bVar24));
  secp256k1_scalar_verify((secp256k1_scalar *)psVar14);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_half(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY_MAGNITUDE(r, 31);

    secp256k1_fe_impl_half(r);
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}